

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlOutputBufferWriteString(xmlOutputBufferPtr out,char *str)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = -1;
  if (((out != (xmlOutputBufferPtr)0x0) && (str != (char *)0x0)) && (out->error == 0)) {
    sVar2 = strlen(str);
    iVar1 = (int)sVar2;
    if (0 < iVar1) {
      iVar1 = xmlOutputBufferWrite(out,iVar1,str);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int
xmlOutputBufferWriteString(xmlOutputBufferPtr out, const char *str) {
    int len;

    if ((out == NULL) || (out->error)) return(-1);
    if (str == NULL)
        return(-1);
    len = strlen(str);

    if (len > 0)
	return(xmlOutputBufferWrite(out, len, str));
    return(len);
}